

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O2

string * capitalize(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  char *pcVar3;
  char *pcVar4;
  ostringstream oss;
  ostringstream aoStack_198 [376];
  int iVar2;
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  pcVar3 = (str->_M_dataplus)._M_p;
  for (pcVar4 = pcVar3; pcVar4 != pcVar3 + str->_M_string_length; pcVar4 = pcVar4 + 1) {
    if (pcVar4 == pcVar3) {
      iVar2 = toupper((int)*pcVar4);
      cVar1 = (char)iVar2;
    }
    else {
      iVar2 = tolower((int)*pcVar4);
      cVar1 = (char)iVar2;
    }
    std::operator<<((ostream *)aoStack_198,cVar1);
    pcVar3 = (str->_M_dataplus)._M_p;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string capitalize(const std::string& str)
{
	std::ostringstream oss;
	for (auto it = str.begin(); it != str.end(); ++it)
	{
		if (it == str.begin())
		{
			oss << static_cast<char>(toupper(*it));
		}
		else
		{
			oss << static_cast<char>(tolower(*it));
		}
	}
	return oss.str();
}